

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalForcesContIntNoDamping
          (ChElementBeamANCF_3333 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_1,__1,__1> *a_lhs;
  double *pdVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  double dVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  Index index;
  void *pvVar65;
  ulong uVar66;
  long lVar67;
  undefined8 *puVar68;
  double *pdVar69;
  char *pcVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  Scalar local_e48;
  undefined1 local_e40 [328];
  double local_cf8;
  undefined1 local_cf0 [16];
  double local_ce0;
  double local_cd8;
  double dStack_cd0;
  double dStack_cc8;
  double dStack_cc0;
  double local_cb8;
  double dStack_cb0;
  double dStack_ca8;
  double dStack_ca0;
  double local_c98;
  double dStack_c90;
  double dStack_c88;
  double dStack_c80;
  double local_c78;
  double dStack_c70;
  double dStack_c68;
  double dStack_c60;
  double local_c58;
  double dStack_c50;
  double dStack_c48;
  double dStack_c40;
  double local_c38;
  double dStack_c30;
  double dStack_c28;
  double dStack_c20;
  double local_c18;
  double dStack_c10;
  double dStack_c08;
  double dStack_c00;
  double local_bf8;
  double dStack_bf0;
  double dStack_be8;
  double dStack_be0;
  double local_bd8;
  double dStack_bd0;
  double dStack_bc8;
  double dStack_bc0;
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  undefined1 local_ba0 [16];
  double local_b90;
  undefined1 local_b88 [16];
  double local_b78;
  double local_b70;
  double dStack_b68;
  double dStack_b60;
  double dStack_b58;
  double local_b50;
  double dStack_b48;
  double dStack_b40;
  double dStack_b38;
  double local_b30;
  double dStack_b28;
  double dStack_b20;
  double dStack_b18;
  double local_b10;
  double dStack_b08;
  double dStack_b00;
  double dStack_af8;
  double local_af0;
  double dStack_ae8;
  double dStack_ae0;
  double dStack_ad8;
  double local_ad0;
  double dStack_ac8;
  double dStack_ac0;
  double dStack_ab8;
  double local_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  double local_a90;
  double dStack_a88;
  double dStack_a80;
  double dStack_a78;
  double local_a70;
  double dStack_a68;
  double dStack_a60;
  double dStack_a58;
  double local_a50;
  double dStack_a48;
  double local_a40;
  undefined1 local_a38 [16];
  double local_a28;
  undefined1 local_a20 [16];
  double local_a10;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  double local_800;
  double dStack_7f8;
  double dStack_7f0;
  double dStack_7e8;
  undefined1 local_7e0 [32];
  double local_7c0;
  double dStack_7b8;
  double dStack_7b0;
  double dStack_7a8;
  double local_7a0;
  double dStack_798;
  double dStack_790;
  double dStack_788;
  double local_780;
  double dStack_778;
  double dStack_770;
  double dStack_768;
  double local_760;
  double dStack_758;
  double dStack_750;
  double dStack_748;
  double local_740;
  double dStack_738;
  double dStack_730;
  double dStack_728;
  double local_720;
  double dStack_718;
  double dStack_710;
  double dStack_708;
  double local_700;
  double dStack_6f8;
  double dStack_6f0;
  double dStack_6e8;
  double local_6e0;
  double dStack_6d8;
  double dStack_6d0;
  double dStack_6c8;
  undefined1 local_6c0 [32];
  double local_6a0;
  double dStack_698;
  double dStack_690;
  double dStack_688;
  undefined1 local_678 [32];
  undefined1 local_658 [32];
  double local_638;
  double dStack_630;
  double dStack_628;
  double dStack_620;
  undefined1 local_618 [32];
  undefined1 local_5f8 [32];
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [32];
  undefined1 local_598 [32];
  undefined1 local_578 [32];
  double local_558;
  double dStack_550;
  double local_548;
  undefined1 local_540 [16];
  double local_530;
  double local_528;
  double dStack_520;
  double local_518;
  double local_510;
  double dStack_508;
  double dStack_500;
  double dStack_4f8;
  double local_4f0;
  double dStack_4e8;
  double dStack_4e0;
  double dStack_4d8;
  undefined1 local_4d0 [32];
  undefined1 local_4b0 [32];
  double local_490;
  double dStack_488;
  double dStack_480;
  double dStack_478;
  undefined1 local_470 [32];
  undefined1 local_450 [32];
  undefined1 local_430 [32];
  undefined1 local_410 [32];
  double local_3f0;
  double dStack_3e8;
  double local_3e0;
  undefined1 local_3d8 [16];
  double local_3c8;
  double local_3c0;
  double dStack_3b8;
  double local_3b0;
  double local_3a8;
  double dStack_3a0;
  double dStack_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  double dStack_378;
  double dStack_370;
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  double local_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double dStack_2b0;
  undefined1 local_2a8 [32];
  double local_288;
  double dStack_280;
  double local_278;
  undefined1 local_270 [16];
  double local_260;
  double local_258;
  double dStack_250;
  double local_248;
  Matrix<double,_9,_3,_1,_9,_3> local_240;
  Matrix3xN local_150;
  
  CalcCoordMatrix(this,&local_150);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 9) {
    pcVar70 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, 3, 9, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 9, 1>>, Option = 0]"
    ;
LAB_0071e039:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar70);
  }
  a_lhs = &this->m_SD;
  local_e40._0_8_ = a_lhs;
  local_e40._8_8_ = &local_150;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0x2d) {
    pcVar70 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 3, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 3, 0>]"
    ;
LAB_0071e05b:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar70);
  }
  memset((Matrix<double,_45,_3,_0,_45,_3> *)local_678,0,0x438);
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.array[0] =
       1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,3,9,1,3,9>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,45,3,0,45,3>>
            ((Matrix<double,_45,_3,_0,_45,_3> *)local_678,
             (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_e40,
             (Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_> *)(local_e40 + 8),
             (Scalar *)&local_240);
  peVar2 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  uVar66 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  dVar4 = (double)(this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
  if (-1 < (long)(uVar66 | (ulong)dVar4)) {
    local_e40._0_8_ =
         (peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[0] * 0.5;
    local_e40._16_8_ =
         (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_data;
    if ((dVar4 == 5.92878775009496e-323) && (uVar66 == 1)) {
      local_740 = local_4f0;
      dStack_738 = dStack_4e8;
      dStack_730 = dStack_4e0;
      dStack_728 = dStack_4d8;
      local_760 = local_638;
      dStack_758 = dStack_630;
      dStack_750 = dStack_628;
      dStack_748 = dStack_620;
      local_900 = local_368;
      auVar57._8_8_ = dStack_4e8;
      auVar57._0_8_ = local_4f0;
      auVar57._16_8_ = dStack_4e0;
      auVar57._24_8_ = dStack_4d8;
      dVar7 = local_658._0_8_;
      dVar18 = local_658._8_8_;
      dVar29 = local_658._16_8_;
      dVar40 = local_658._24_8_;
      local_8e0 = local_5b8;
      local_860 = local_430;
      local_820 = local_2e8;
      local_840 = local_410;
      local_9c0 = local_598;
      auVar85 = vmulpd_avx512vl(local_4d0,local_4d0);
      local_8c0 = local_348;
      auVar86 = vmulpd_avx512vl(local_368,local_368);
      local_7e0 = local_2a8;
      local_720 = (local_678._0_8_ * local_678._0_8_ + local_510 * local_510 + local_3a8 * local_3a8
                  + -1.0) * (double)local_e40._0_8_ *
                            *(double *)*(undefined1 (*) [32])local_e40._16_8_;
      dStack_718 = (local_678._8_8_ * local_678._8_8_ + dStack_508 * dStack_508 +
                    dStack_3a0 * dStack_3a0 + -1.0) *
                   (double)local_e40._0_8_ * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 8)
      ;
      dStack_710 = (local_678._16_8_ * local_678._16_8_ + dStack_500 * dStack_500 +
                    dStack_398 * dStack_398 + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x10);
      dStack_708 = (local_678._24_8_ * local_678._24_8_ + dStack_4f8 * dStack_4f8 +
                    dStack_390 * dStack_390 + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x18);
      local_700 = (dVar7 * dVar7 + local_4f0 * local_4f0 + local_388 * local_388 + -1.0) *
                  (double)local_e40._0_8_ *
                  *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x20);
      dStack_6f8 = (dVar18 * dVar18 + dStack_4e8 * dStack_4e8 + dStack_380 * dStack_380 + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 8);
      dStack_6f0 = (dVar29 * dVar29 + dStack_4e0 * dStack_4e0 + dStack_378 * dStack_378 + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x10);
      dStack_6e8 = (dVar40 * dVar40 + dStack_4d8 * dStack_4d8 + dStack_370 * dStack_370 + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x18);
      local_6e0 = (local_638 * local_638 + auVar85._0_8_ + auVar86._0_8_ + -1.0) *
                  (double)local_e40._0_8_ *
                  *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x40);
      dStack_6d8 = (dStack_630 * dStack_630 + auVar85._8_8_ + auVar86._8_8_ + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 8);
      dStack_6d0 = (dStack_628 * dStack_628 + auVar85._16_8_ + auVar86._16_8_ + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x10);
      dStack_6c8 = (dStack_620 * dStack_620 + auVar85._24_8_ + auVar86._24_8_ + -1.0) *
                   (double)local_e40._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x18);
      auVar85 = vmulpd_avx512vl(local_618,local_618);
      dVar8 = local_4b0._0_8_;
      dVar19 = local_4b0._8_8_;
      dVar30 = local_4b0._16_8_;
      dVar41 = local_4b0._24_8_;
      dVar9 = local_348._0_8_;
      dVar20 = local_348._8_8_;
      dVar31 = local_348._16_8_;
      dVar42 = local_348._24_8_;
      dVar10 = local_5f8._0_8_;
      dVar21 = local_5f8._8_8_;
      dVar32 = local_5f8._16_8_;
      dVar43 = local_5f8._24_8_;
      auVar94._0_8_ = auVar85._0_8_ + dVar8 * dVar8 + dVar9 * dVar9 + -1.0;
      auVar94._8_8_ = auVar85._8_8_ + dVar19 * dVar19 + dVar20 * dVar20 + -1.0;
      auVar94._16_8_ = auVar85._16_8_ + dVar30 * dVar30 + dVar31 * dVar31 + -1.0;
      auVar94._24_8_ = auVar85._24_8_ + dVar41 * dVar41 + dVar42 * dVar42 + -1.0;
      dVar11 = local_328._0_8_;
      dVar22 = local_328._8_8_;
      dVar33 = local_328._16_8_;
      dVar44 = local_328._24_8_;
      dVar12 = local_470._0_8_;
      dVar23 = local_470._8_8_;
      dVar34 = local_470._16_8_;
      dVar45 = local_470._24_8_;
      local_8a0 = local_328;
      dVar13 = local_5d8._0_8_;
      dVar24 = local_5d8._8_8_;
      dVar35 = local_5d8._16_8_;
      dVar46 = local_5d8._24_8_;
      dVar14 = local_308._0_8_;
      dVar25 = local_308._8_8_;
      dVar36 = local_308._16_8_;
      dVar47 = local_308._24_8_;
      dVar4 = *(double *)
               ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array + 8) * 0.5;
      auVar115._8_8_ = dVar4;
      auVar115._0_8_ = dVar4;
      auVar115._16_8_ = dVar4;
      auVar115._24_8_ = dVar4;
      dVar110 = *(double *)
                 ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x10) * 0.5;
      auVar85 = vmulpd_avx512vl(auVar115,*(undefined1 (*) [32])local_e40._16_8_);
      local_6c0 = vmulpd_avx512vl(auVar94,auVar85);
      local_6a0 = (dVar10 * dVar10 + local_490 * local_490 + dVar11 * dVar11 + -1.0) *
                  dVar4 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x20);
      dStack_698 = (dVar21 * dVar21 + dStack_488 * dStack_488 + dVar22 * dVar22 + -1.0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 8);
      dStack_690 = (dVar32 * dVar32 + dStack_480 * dStack_480 + dVar33 * dVar33 + -1.0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x10);
      dStack_688 = (dVar43 * dVar43 + dStack_478 * dStack_478 + dVar44 * dVar44 + -1.0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x18);
      local_800 = local_2c8;
      dStack_7f8 = dStack_2c0;
      dStack_7f0 = dStack_2b8;
      dStack_7e8 = dStack_2b0;
      dVar95 = (dVar13 * dVar13 + dVar12 * dVar12 + dVar14 * dVar14 + -1.0) *
               dVar4 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x40);
      dVar99 = (dVar24 * dVar24 + dVar23 * dVar23 + dVar25 * dVar25 + -1.0) *
               dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 8);
      dVar103 = (dVar35 * dVar35 + dVar34 * dVar34 + dVar36 * dVar36 + -1.0) *
                dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x10);
      dVar107 = (dVar46 * dVar46 + dVar45 * dVar45 + dVar47 * dVar47 + -1.0) *
                dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x18);
      auVar85 = vmulpd_avx512vl(local_5b8,local_5b8);
      dVar15 = local_450._0_8_;
      dVar26 = local_450._8_8_;
      dVar37 = local_450._16_8_;
      dVar48 = local_450._24_8_;
      dVar16 = local_430._0_8_;
      dVar27 = local_430._8_8_;
      dVar38 = local_430._16_8_;
      dVar49 = local_430._24_8_;
      auVar86 = vmulpd_avx512vl(local_2e8,local_2e8);
      auVar87 = vmulpd_avx512vl(local_598,local_598);
      auVar88 = vmulpd_avx512vl(local_410,local_410);
      local_9e0 = local_578;
      dVar17 = local_2a8._0_8_;
      dVar28 = local_2a8._8_8_;
      dVar39 = local_2a8._16_8_;
      dVar50 = local_2a8._24_8_;
      local_9a0 = local_470;
      dVar96 = (auVar85._0_8_ + dVar15 * dVar15 + auVar86._0_8_ + -1.0) *
               dVar110 * *(double *)*(undefined1 (*) [32])local_e40._16_8_;
      dVar100 = (auVar85._8_8_ + dVar26 * dVar26 + auVar86._8_8_ + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 8);
      dVar104 = (auVar85._16_8_ + dVar37 * dVar37 + auVar86._16_8_ + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x10);
      dVar108 = (auVar85._24_8_ + dVar48 * dVar48 + auVar86._24_8_ + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x18);
      dVar97 = (auVar87._0_8_ + dVar16 * dVar16 + local_2c8 * local_2c8 + -1.0) *
               dVar110 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x20);
      dVar101 = (auVar87._8_8_ + dVar27 * dVar27 + dStack_2c0 * dStack_2c0 + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 8);
      dVar105 = (auVar87._16_8_ + dVar38 * dVar38 + dStack_2b8 * dStack_2b8 + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x10);
      dVar109 = (auVar87._24_8_ + dVar49 * dVar49 + dStack_2b0 * dStack_2b0 + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x18);
      auVar85 = vmulpd_avx512vl(local_470,local_410);
      auVar86._8_8_ = dStack_380;
      auVar86._0_8_ = local_388;
      auVar86._16_8_ = dStack_378;
      auVar86._24_8_ = dStack_370;
      auVar56._8_8_ = dStack_630;
      auVar56._0_8_ = local_638;
      auVar56._16_8_ = dStack_628;
      auVar56._24_8_ = dStack_620;
      dVar98 = (local_578._0_8_ * local_578._0_8_ + auVar88._0_8_ + dVar17 * dVar17 + -1.0) *
               dVar110 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x40);
      dVar102 = (local_578._8_8_ * local_578._8_8_ + auVar88._8_8_ + dVar28 * dVar28 + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 8);
      dVar106 = (local_578._16_8_ * local_578._16_8_ + auVar88._16_8_ + dVar39 * dVar39 + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x10);
      dVar110 = (local_578._24_8_ * local_578._24_8_ + auVar88._24_8_ + dVar50 * dVar50 + -1.0) *
                dVar110 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x18);
      auVar87 = vmulpd_avx512vl(local_4b0,local_450);
      auVar89 = vmulpd_avx512vl(local_618,local_5b8);
      auVar90 = vmulpd_avx512vl(local_348,local_2e8);
      auVar91 = vmulpd_avx512vl(local_5f8,local_598);
      local_a00 = local_308;
      local_940 = local_678;
      auVar92 = vmulpd_avx512vl(local_5d8,local_578);
      auVar88._8_8_ = dStack_3a0;
      auVar88._0_8_ = local_3a8;
      auVar88._16_8_ = dStack_398;
      auVar88._24_8_ = dStack_390;
      auVar93 = vmulpd_avx512vl(local_308,local_2a8);
      dVar4 = *(double *)
               ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array + 0x18);
      local_7c0 = (auVar89._0_8_ + auVar87._0_8_ + auVar90._0_8_) *
                  dVar4 * *(double *)*(undefined1 (*) [32])local_e40._16_8_;
      dStack_7b8 = (auVar89._8_8_ + auVar87._8_8_ + auVar90._8_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 8);
      dStack_7b0 = (auVar89._16_8_ + auVar87._16_8_ + auVar90._16_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x10);
      dStack_7a8 = (auVar89._24_8_ + auVar87._24_8_ + auVar90._24_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x18);
      auVar87 = vmulpd_avx512vl(auVar57,local_430);
      local_920 = local_658;
      local_7a0 = (auVar91._0_8_ + local_490 * dVar16 + dVar11 * local_2c8) *
                  dVar4 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x20);
      dStack_798 = (auVar91._8_8_ + dStack_488 * dVar27 + dVar22 * dStack_2c0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 8);
      dStack_790 = (auVar91._16_8_ + dStack_480 * dVar38 + dVar33 * dStack_2b8) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x10);
      dStack_788 = (auVar91._24_8_ + dStack_478 * dVar49 + dVar44 * dStack_2b0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x18);
      local_980 = local_618;
      local_780 = (auVar92._0_8_ + auVar85._0_8_ + auVar93._0_8_) *
                  dVar4 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x40);
      dStack_778 = (auVar92._8_8_ + auVar85._8_8_ + auVar93._8_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 8);
      dStack_770 = (auVar92._16_8_ + auVar85._16_8_ + auVar93._16_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x10);
      dStack_768 = (auVar92._24_8_ + auVar85._24_8_ + auVar93._24_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x18);
      auVar85 = vmulpd_avx512vl(local_678,local_5b8);
      auVar90._8_8_ = dStack_508;
      auVar90._0_8_ = local_510;
      auVar90._16_8_ = dStack_500;
      auVar90._24_8_ = dStack_4f8;
      auVar89 = vmulpd_avx512vl(local_4d0,local_410);
      auVar91 = vmulpd_avx512vl(auVar90,local_450);
      auVar88 = vmulpd_avx512vl(auVar88,local_2e8);
      auVar111._0_8_ = auVar85._0_8_ + auVar91._0_8_ + auVar88._0_8_;
      auVar111._8_8_ = auVar85._8_8_ + auVar91._8_8_ + auVar88._8_8_;
      auVar111._16_8_ = auVar85._16_8_ + auVar91._16_8_ + auVar88._16_8_;
      auVar111._24_8_ = auVar85._24_8_ + auVar91._24_8_ + auVar88._24_8_;
      auVar85 = vmulpd_avx512vl(local_658,local_598);
      auVar113._0_8_ = auVar85._0_8_ + auVar87._0_8_ + local_388 * local_2c8;
      auVar113._8_8_ = auVar85._8_8_ + auVar87._8_8_ + dStack_380 * dStack_2c0;
      auVar113._16_8_ = auVar85._16_8_ + auVar87._16_8_ + dStack_378 * dStack_2b8;
      auVar113._24_8_ = auVar85._24_8_ + auVar87._24_8_ + dStack_370 * dStack_2b0;
      auVar85 = vmulpd_avx512vl(auVar56,local_578);
      auVar85 = vaddpd_avx512vl(auVar85,auVar89);
      auVar87 = vmulpd_avx512vl(local_368,local_2a8);
      auVar85 = vaddpd_avx512vl(auVar85,auVar87);
      auVar72._8_8_ = 0;
      auVar72._0_8_ =
           *(double *)
            ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array + 0x20);
      vmovsd_avx512f(auVar72);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar4;
      auVar87 = vbroadcastsd_avx512vl(auVar71);
      auVar88 = vmulpd_avx512vl(auVar87,*(undefined1 (*) [32])local_e40._16_8_);
      auVar88 = vmulpd_avx512vl(auVar111,auVar88);
      auVar89 = vmulpd_avx512vl(auVar87,*(undefined1 (*) [32])(local_e40._16_8_ + 0x20));
      local_880 = vmulpd_avx512vl(auVar113,auVar89);
      auVar87 = vmulpd_avx512vl(auVar87,*(undefined1 (*) [32])(local_e40._16_8_ + 0x40));
      local_960 = local_5f8;
      auVar94 = vmulpd_avx512vl(auVar85,auVar87);
      auVar87 = vmulpd_avx512vl(local_678,local_618);
      auVar85._8_8_ = dStack_488;
      auVar85._0_8_ = local_490;
      auVar85._16_8_ = dStack_480;
      auVar85._24_8_ = dStack_478;
      auVar89 = vmulpd_avx512vl(local_658,local_5f8);
      auVar91 = vmulpd_avx512vl(local_368,local_308);
      auVar58._8_8_ = dStack_718;
      auVar58._0_8_ = local_720;
      auVar58._16_8_ = dStack_710;
      auVar58._24_8_ = dStack_708;
      auVar85 = vmulpd_avx512vl(auVar57,auVar85);
      auVar86 = vmulpd_avx512vl(auVar86,local_328);
      auVar60._8_8_ = dStack_6d8;
      auVar60._0_8_ = local_6e0;
      auVar60._16_8_ = dStack_6d0;
      auVar60._24_8_ = dStack_6c8;
      dVar4 = *(double *)
               ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array + 0x28);
      auVar116._0_8_ =
           (auVar87._0_8_ + local_510 * dVar8 + local_3a8 * dVar9) *
           dVar4 * *(double *)*(undefined1 (*) [32])local_e40._16_8_;
      auVar116._8_8_ =
           (auVar87._8_8_ + dStack_508 * dVar19 + dStack_3a0 * dVar20) *
           dVar4 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 8);
      auVar116._16_8_ =
           (auVar87._16_8_ + dStack_500 * dVar30 + dStack_398 * dVar31) *
           dVar4 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x10);
      auVar116._24_8_ =
           (auVar87._24_8_ + dStack_4f8 * dVar41 + dStack_390 * dVar42) *
           dVar4 * *(double *)(*(undefined1 (*) [32])local_e40._16_8_ + 0x18);
      auVar114._0_8_ =
           (auVar89._0_8_ + auVar85._0_8_ + auVar86._0_8_) *
           dVar4 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x20);
      auVar114._8_8_ =
           (auVar89._8_8_ + auVar85._8_8_ + auVar86._8_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 8);
      auVar114._16_8_ =
           (auVar89._16_8_ + auVar85._16_8_ + auVar86._16_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x10);
      auVar114._24_8_ =
           (auVar89._24_8_ + auVar85._24_8_ + auVar86._24_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x20) + 0x18);
      auVar85 = vmulpd_avx512vl(local_678,auVar58);
      auVar112._0_8_ =
           (dVar13 * local_638 + dVar12 * local_4d0._0_8_ + auVar91._0_8_) *
           dVar4 * *(double *)*(undefined1 (*) [32])(local_e40._16_8_ + 0x40);
      auVar112._8_8_ =
           (dVar24 * dStack_630 + dVar23 * local_4d0._8_8_ + auVar91._8_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 8);
      auVar112._16_8_ =
           (dVar35 * dStack_628 + dVar34 * local_4d0._16_8_ + auVar91._16_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x10);
      auVar112._24_8_ =
           (dVar46 * dStack_620 + dVar45 * local_4d0._24_8_ + auVar91._24_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e40._16_8_ + 0x40) + 0x18);
      auVar59._8_8_ = dStack_6f8;
      auVar59._0_8_ = local_700;
      auVar59._16_8_ = dStack_6f0;
      auVar59._24_8_ = dStack_6e8;
      auVar86 = vmulpd_avx512vl(local_5b8,auVar88);
      local_e40._0_8_ = auVar86._0_8_ + auVar85._0_8_ + local_618._0_8_ * auVar116._0_8_;
      local_e40._8_8_ = auVar86._8_8_ + auVar85._8_8_ + local_618._8_8_ * auVar116._8_8_;
      local_e40._16_8_ = auVar86._16_8_ + auVar85._16_8_ + local_618._16_8_ * auVar116._16_8_;
      local_e40._24_8_ = auVar86._24_8_ + auVar85._24_8_ + local_618._24_8_ * auVar116._24_8_;
      auVar85 = vmulpd_avx512vl(local_5f8,auVar114);
      auVar86 = vmulpd_avx512vl(local_598,local_880);
      local_e40._32_8_ = auVar86._0_8_ + dVar7 * local_700 + auVar85._0_8_;
      local_e40._40_8_ = auVar86._8_8_ + dVar18 * dStack_6f8 + auVar85._8_8_;
      local_e40._48_8_ = auVar86._16_8_ + dVar29 * dStack_6f0 + auVar85._16_8_;
      local_e40._56_8_ = auVar86._24_8_ + dVar40 * dStack_6e8 + auVar85._24_8_;
      auVar85 = vmulpd_avx512vl(auVar56,auVar60);
      auVar86 = vmulpd_avx512vl(local_578,auVar94);
      local_e40._64_8_ = auVar86._0_8_ + auVar85._0_8_ + dVar13 * auVar112._0_8_;
      local_e40._72_8_ = auVar86._8_8_ + auVar85._8_8_ + dVar24 * auVar112._8_8_;
      local_e40._80_8_ = auVar86._16_8_ + auVar85._16_8_ + dVar35 * auVar112._16_8_;
      local_e40._88_8_ = auVar86._24_8_ + auVar85._24_8_ + dVar46 * auVar112._24_8_;
      auVar61._8_8_ = dStack_698;
      auVar61._0_8_ = local_6a0;
      auVar61._16_8_ = dStack_690;
      auVar61._24_8_ = dStack_688;
      auVar85 = vmulpd_avx512vl(auVar90,auVar58);
      auVar89._8_8_ = dStack_3a0;
      auVar89._0_8_ = local_3a8;
      auVar89._16_8_ = dStack_398;
      auVar89._24_8_ = dStack_390;
      auVar86 = vmulpd_avx512vl(local_450,auVar88);
      local_cd8 = auVar86._0_8_ + auVar85._0_8_ + dVar8 * auVar116._0_8_;
      dStack_cd0 = auVar86._8_8_ + auVar85._8_8_ + dVar19 * auVar116._8_8_;
      dStack_cc8 = auVar86._16_8_ + auVar85._16_8_ + dVar30 * auVar116._16_8_;
      dStack_cc0 = auVar86._24_8_ + auVar85._24_8_ + dVar41 * auVar116._24_8_;
      auVar85 = vmulpd_avx512vl(auVar57,auVar59);
      auVar86 = vmulpd_avx512vl(local_430,local_880);
      local_cb8 = auVar86._0_8_ + auVar85._0_8_ + local_490 * auVar114._0_8_;
      dStack_cb0 = auVar86._8_8_ + auVar85._8_8_ + dStack_488 * auVar114._8_8_;
      dStack_ca8 = auVar86._16_8_ + auVar85._16_8_ + dStack_480 * auVar114._16_8_;
      dStack_ca0 = auVar86._24_8_ + auVar85._24_8_ + dStack_478 * auVar114._24_8_;
      auVar92._8_8_ = dVar99;
      auVar92._0_8_ = dVar95;
      auVar92._16_8_ = dVar103;
      auVar92._24_8_ = dVar107;
      auVar85 = vmulpd_avx512vl(local_4d0,auVar60);
      auVar86 = vmulpd_avx512vl(local_410,auVar94);
      auVar87._8_8_ = dStack_380;
      auVar87._0_8_ = local_388;
      auVar87._16_8_ = dStack_378;
      auVar87._24_8_ = dStack_370;
      local_c98 = auVar86._0_8_ + auVar85._0_8_ + dVar12 * auVar112._0_8_;
      dStack_c90 = auVar86._8_8_ + auVar85._8_8_ + dVar23 * auVar112._8_8_;
      dStack_c88 = auVar86._16_8_ + auVar85._16_8_ + dVar34 * auVar112._16_8_;
      dStack_c80 = auVar86._24_8_ + auVar85._24_8_ + dVar45 * auVar112._24_8_;
      auVar85 = vmulpd_avx512vl(auVar89,auVar58);
      auVar86 = vmulpd_avx512vl(local_348,auVar116);
      auVar90 = vmulpd_avx512vl(local_2e8,auVar88);
      local_b70 = auVar90._0_8_ + auVar85._0_8_ + auVar86._0_8_;
      dStack_b68 = auVar90._8_8_ + auVar85._8_8_ + auVar86._8_8_;
      dStack_b60 = auVar90._16_8_ + auVar85._16_8_ + auVar86._16_8_;
      dStack_b58 = auVar90._24_8_ + auVar85._24_8_ + auVar86._24_8_;
      auVar85 = vmulpd_avx512vl(local_328,auVar114);
      auVar86 = vmulpd_avx512vl(auVar87,auVar59);
      auVar54._8_8_ = dStack_798;
      auVar54._0_8_ = local_7a0;
      auVar54._16_8_ = dStack_790;
      auVar54._24_8_ = dStack_788;
      local_b50 = local_2c8 * local_880._0_8_ + auVar86._0_8_ + auVar85._0_8_;
      dStack_b48 = dStack_2c0 * local_880._8_8_ + auVar86._8_8_ + auVar85._8_8_;
      dStack_b40 = dStack_2b8 * local_880._16_8_ + auVar86._16_8_ + auVar85._16_8_;
      dStack_b38 = dStack_2b0 * local_880._24_8_ + auVar86._24_8_ + auVar85._24_8_;
      auVar55._8_8_ = dStack_778;
      auVar55._0_8_ = local_780;
      auVar55._16_8_ = dStack_770;
      auVar55._24_8_ = dStack_768;
      auVar85 = vmulpd_avx512vl(local_2a8,auVar94);
      local_b30 = auVar85._0_8_ + local_368._0_8_ * local_6e0 + dVar14 * auVar112._0_8_;
      dStack_b28 = auVar85._8_8_ + local_368._8_8_ * dStack_6d8 + dVar25 * auVar112._8_8_;
      dStack_b20 = auVar85._16_8_ + local_368._16_8_ * dStack_6d0 + dVar36 * auVar112._16_8_;
      dStack_b18 = auVar85._24_8_ + local_368._24_8_ * dStack_6c8 + dVar47 * auVar112._24_8_;
      auVar85 = vmulpd_avx512vl(local_678,auVar116);
      auVar86 = vmulpd_avx512vl(local_618,local_6c0);
      auVar53._8_8_ = dStack_7b8;
      auVar53._0_8_ = local_7c0;
      auVar53._16_8_ = dStack_7b0;
      auVar53._24_8_ = dStack_7a8;
      auVar90 = vmulpd_avx512vl(local_5b8,auVar53);
      local_e40._96_8_ = auVar90._0_8_ + auVar86._0_8_ + auVar85._0_8_;
      local_e40._104_8_ = auVar90._8_8_ + auVar86._8_8_ + auVar85._8_8_;
      local_e40._112_8_ = auVar90._16_8_ + auVar86._16_8_ + auVar85._16_8_;
      local_e40._120_8_ = auVar90._24_8_ + auVar86._24_8_ + auVar85._24_8_;
      auVar85 = vmulpd_avx512vl(local_5f8,auVar61);
      auVar86 = vmulpd_avx512vl(local_658,auVar114);
      auVar90 = vmulpd_avx512vl(local_598,auVar54);
      local_e40._128_8_ = auVar90._0_8_ + auVar85._0_8_ + auVar86._0_8_;
      local_e40._136_8_ = auVar90._8_8_ + auVar85._8_8_ + auVar86._8_8_;
      local_e40._144_8_ = auVar90._16_8_ + auVar85._16_8_ + auVar86._16_8_;
      local_e40._152_8_ = auVar90._24_8_ + auVar85._24_8_ + auVar86._24_8_;
      auVar85 = vmulpd_avx512vl(local_5d8,auVar92);
      auVar91._8_8_ = dStack_508;
      auVar91._0_8_ = local_510;
      auVar91._16_8_ = dStack_500;
      auVar91._24_8_ = dStack_4f8;
      auVar86 = vmulpd_avx512vl(auVar56,auVar112);
      auVar90 = vmulpd_avx512vl(local_578,auVar55);
      local_e40._160_8_ = auVar90._0_8_ + auVar85._0_8_ + auVar86._0_8_;
      local_e40._168_8_ = auVar90._8_8_ + auVar85._8_8_ + auVar86._8_8_;
      local_e40._176_8_ = auVar90._16_8_ + auVar85._16_8_ + auVar86._16_8_;
      local_e40._184_8_ = auVar90._24_8_ + auVar85._24_8_ + auVar86._24_8_;
      auVar85 = vmulpd_avx512vl(local_4b0,local_6c0);
      auVar86 = vmulpd_avx512vl(auVar91,auVar116);
      auVar90 = vmulpd_avx512vl(local_450,auVar53);
      local_c78 = auVar90._0_8_ + auVar85._0_8_ + auVar86._0_8_;
      dStack_c70 = auVar90._8_8_ + auVar85._8_8_ + auVar86._8_8_;
      dStack_c68 = auVar90._16_8_ + auVar85._16_8_ + auVar86._16_8_;
      dStack_c60 = auVar90._24_8_ + auVar85._24_8_ + auVar86._24_8_;
      auVar85 = vmulpd_avx512vl(auVar57,auVar114);
      auVar86 = vmulpd_avx512vl(auVar87,auVar114);
      auVar90 = vmulpd_avx512vl(local_430,auVar54);
      local_c58 = auVar90._0_8_ + local_490 * local_6a0 + auVar85._0_8_;
      dStack_c50 = auVar90._8_8_ + dStack_488 * dStack_698 + auVar85._8_8_;
      dStack_c48 = auVar90._16_8_ + dStack_480 * dStack_690 + auVar85._16_8_;
      dStack_c40 = auVar90._24_8_ + dStack_478 * dStack_688 + auVar85._24_8_;
      auVar85 = vmulpd_avx512vl(local_470,auVar92);
      auVar90 = vmulpd_avx512vl(local_4d0,auVar112);
      local_c38 = local_410._0_8_ * local_780 + auVar85._0_8_ + auVar90._0_8_;
      dStack_c30 = local_410._8_8_ * dStack_778 + auVar85._8_8_ + auVar90._8_8_;
      dStack_c28 = local_410._16_8_ * dStack_770 + auVar85._16_8_ + auVar90._16_8_;
      dStack_c20 = local_410._24_8_ * dStack_768 + auVar85._24_8_ + auVar90._24_8_;
      auVar85 = vmulpd_avx512vl(local_348,local_6c0);
      auVar93._8_8_ = dVar100;
      auVar93._0_8_ = dVar96;
      auVar93._16_8_ = dVar104;
      auVar93._24_8_ = dVar108;
      auVar90 = vmulpd_avx512vl(local_2e8,auVar53);
      local_b10 = auVar90._0_8_ + auVar85._0_8_ + local_3a8 * auVar116._0_8_;
      dStack_b08 = auVar90._8_8_ + auVar85._8_8_ + dStack_3a0 * auVar116._8_8_;
      dStack_b00 = auVar90._16_8_ + auVar85._16_8_ + dStack_398 * auVar116._16_8_;
      dStack_af8 = auVar90._24_8_ + auVar85._24_8_ + dStack_390 * auVar116._24_8_;
      auVar85 = vmulpd_avx512vl(local_328,auVar61);
      auVar51._8_8_ = dVar101;
      auVar51._0_8_ = dVar97;
      auVar51._16_8_ = dVar105;
      auVar51._24_8_ = dVar109;
      local_af0 = local_2c8 * local_7a0 + auVar85._0_8_ + auVar86._0_8_;
      dStack_ae8 = dStack_2c0 * dStack_798 + auVar85._8_8_ + auVar86._8_8_;
      dStack_ae0 = dStack_2b8 * dStack_790 + auVar85._16_8_ + auVar86._16_8_;
      dStack_ad8 = dStack_2b0 * dStack_788 + auVar85._24_8_ + auVar86._24_8_;
      local_ad0 = dVar17 * local_780 + dVar95 * dVar14 + local_368._0_8_ * auVar112._0_8_;
      dStack_ac8 = dVar28 * dStack_778 + dVar99 * dVar25 + local_368._8_8_ * auVar112._8_8_;
      dStack_ac0 = dVar39 * dStack_770 + dVar103 * dVar36 + local_368._16_8_ * auVar112._16_8_;
      dStack_ab8 = dVar50 * dStack_768 + dVar107 * dVar47 + local_368._24_8_ * auVar112._24_8_;
      auVar85 = vmulpd_avx512vl(auVar53,local_618);
      auVar86 = vmulpd_avx512vl(auVar88,local_678);
      auVar90 = vmulpd_avx512vl(local_5b8,auVar93);
      local_e40._192_8_ = auVar90._0_8_ + auVar85._0_8_ + auVar86._0_8_;
      local_e40._200_8_ = auVar90._8_8_ + auVar85._8_8_ + auVar86._8_8_;
      local_e40._208_8_ = auVar90._16_8_ + auVar85._16_8_ + auVar86._16_8_;
      local_e40._216_8_ = auVar90._24_8_ + auVar85._24_8_ + auVar86._24_8_;
      auVar85 = vmulpd_avx512vl(local_598,auVar51);
      local_e40._224_8_ = auVar85._0_8_ + local_7a0 * dVar10 + local_880._0_8_ * dVar7;
      local_e40._232_8_ = auVar85._8_8_ + dStack_798 * dVar21 + local_880._8_8_ * dVar18;
      local_e40._240_8_ = auVar85._16_8_ + dStack_790 * dVar32 + local_880._16_8_ * dVar29;
      local_e40._248_8_ = auVar85._24_8_ + dStack_788 * dVar43 + local_880._24_8_ * dVar40;
      auVar52._8_8_ = dVar102;
      auVar52._0_8_ = dVar98;
      auVar52._16_8_ = dVar106;
      auVar52._24_8_ = dVar110;
      auVar85 = vmulpd_avx512vl(auVar56,auVar94);
      auVar86 = vmulpd_avx512vl(local_578,auVar52);
      local_e40._256_8_ = auVar86._0_8_ + local_780 * dVar13 + auVar85._0_8_;
      local_e40._264_8_ = auVar86._8_8_ + dStack_778 * dVar24 + auVar85._8_8_;
      local_e40._272_8_ = auVar86._16_8_ + dStack_770 * dVar35 + auVar85._16_8_;
      local_e40._280_8_ = auVar86._24_8_ + dStack_768 * dVar46 + auVar85._24_8_;
      auVar85 = vmulpd_avx512vl(auVar53,local_4b0);
      auVar86 = vmulpd_avx512vl(auVar91,auVar88);
      local_c18 = dVar96 * dVar15 + auVar85._0_8_ + auVar86._0_8_;
      dStack_c10 = dVar100 * dVar26 + auVar85._8_8_ + auVar86._8_8_;
      dStack_c08 = dVar104 * dVar37 + auVar85._16_8_ + auVar86._16_8_;
      dStack_c00 = dVar108 * dVar48 + auVar85._24_8_ + auVar86._24_8_;
      auVar85 = vmulpd_avx512vl(local_328,auVar54);
      auVar86 = vmulpd_avx512vl(auVar57,local_880);
      auVar90 = vmulpd_avx512vl(local_430,auVar51);
      local_bf8 = auVar90._0_8_ + local_490 * local_7a0 + auVar86._0_8_;
      dStack_bf0 = auVar90._8_8_ + dStack_488 * dStack_798 + auVar86._8_8_;
      dStack_be8 = auVar90._16_8_ + dStack_480 * dStack_790 + auVar86._16_8_;
      dStack_be0 = auVar90._24_8_ + dStack_478 * dStack_788 + auVar86._24_8_;
      auVar86 = vmulpd_avx512vl(local_470,auVar55);
      auVar90 = vmulpd_avx512vl(local_4d0,auVar94);
      local_bd8 = local_410._0_8_ * dVar98 + auVar86._0_8_ + auVar90._0_8_;
      dStack_bd0 = local_410._8_8_ * dVar102 + auVar86._8_8_ + auVar90._8_8_;
      dStack_bc8 = local_410._16_8_ * dVar106 + auVar86._16_8_ + auVar90._16_8_;
      dStack_bc0 = local_410._24_8_ * dVar110 + auVar86._24_8_ + auVar90._24_8_;
      auVar86 = vmulpd_avx512vl(local_348,auVar53);
      auVar88 = vmulpd_avx512vl(auVar89,auVar88);
      local_ab0 = dVar96 * local_2e8._0_8_ + auVar86._0_8_ + auVar88._0_8_;
      dStack_aa8 = dVar100 * local_2e8._8_8_ + auVar86._8_8_ + auVar88._8_8_;
      dStack_aa0 = dVar104 * local_2e8._16_8_ + auVar86._16_8_ + auVar88._16_8_;
      dStack_a98 = dVar108 * local_2e8._24_8_ + auVar86._24_8_ + auVar88._24_8_;
      auVar86 = vmulpd_avx512vl(local_368,auVar94);
      auVar87 = vmulpd_avx512vl(auVar87,local_880);
      local_a90 = local_2c8 * dVar97 + auVar85._0_8_ + auVar87._0_8_;
      dStack_a88 = dStack_2c0 * dVar101 + auVar85._8_8_ + auVar87._8_8_;
      dStack_a80 = dStack_2b8 * dVar105 + auVar85._16_8_ + auVar87._16_8_;
      dStack_a78 = dStack_2b0 * dVar109 + auVar85._24_8_ + auVar87._24_8_;
      local_a70 = dVar17 * dVar98 + local_780 * dVar14 + auVar86._0_8_;
      dStack_a68 = dVar28 * dVar102 + dStack_778 * dVar25 + auVar86._8_8_;
      dStack_a60 = dVar39 * dVar106 + dStack_770 * dVar36 + auVar86._16_8_;
      dStack_a58 = dVar50 * dVar110 + dStack_768 * dVar47 + auVar86._24_8_;
      uVar66 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      uVar5 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      if ((long)(uVar66 | uVar5) < 0) goto LAB_0071df9b;
      if ((uVar5 == 3) && (uVar66 == 1)) {
        pauVar6 = (undefined1 (*) [16])
                  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        auVar71 = vmovddup_avx512vl(ZEXT816(0xbff0000000000000));
        p_Var3 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = local_3b0;
        auVar72 = vmulsd_avx512f(auVar119,auVar119);
        auVar74._0_8_ = local_558 * local_558 + local_3f0 * local_3f0 + local_288 * local_288 + -1.0
        ;
        auVar74._8_8_ =
             dStack_550 * dStack_550 + dStack_3e8 * dStack_3e8 + dStack_280 * dStack_280 + -1.0;
        auVar73._8_8_ = 0x3fe0000000000000;
        auVar73._0_8_ = 0x3fe0000000000000;
        auVar73 = vmulpd_avx512vl(*pauVar6,auVar73);
        auVar74 = vmulpd_avx512vl(auVar74,auVar73);
        peVar2 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        dVar4 = *(double *)pauVar6[1] * 0.5;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = local_278 * local_278 + local_548 * local_548 + local_3e0 * local_3e0 + -1.0
        ;
        auVar117._8_8_ = 0;
        auVar117._0_8_ = dVar4;
        auVar75 = vmulsd_avx512f(auVar76,auVar117);
        auVar81._0_8_ =
             local_540._0_8_ * local_540._0_8_ + local_3d8._0_8_ * local_3d8._0_8_ +
             local_270._0_8_ * local_270._0_8_;
        auVar81._8_8_ =
             local_540._8_8_ * local_540._8_8_ + local_3d8._8_8_ * local_3d8._8_8_ +
             local_270._8_8_ * local_270._8_8_;
        auVar76 = vaddpd_avx512vl(auVar81,auVar71);
        auVar76 = vmulpd_avx512vl(auVar73,auVar76);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = local_260;
        auVar77 = vmulsd_avx512f(auVar84,auVar84);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = local_530 * local_530 + local_3c8 * local_3c8;
        auVar77 = vaddsd_avx512f(auVar82,auVar77);
        auVar77 = vaddsd_avx512f(auVar77,ZEXT816(0xbff0000000000000));
        auVar77 = vmulsd_avx512f(auVar117,auVar77);
        auVar79._0_8_ = local_528 * local_528 + local_3c0 * local_3c0 + local_258 * local_258;
        auVar79._8_8_ = dStack_520 * dStack_520 + dStack_3b8 * dStack_3b8 + dStack_250 * dStack_250;
        auVar71 = vaddpd_avx512vl(auVar79,auVar71);
        auVar71 = vmulpd_avx512vl(auVar73,auVar71);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = local_518 * local_518;
        auVar72 = vaddsd_avx512f(auVar83,auVar72);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = local_248;
        auVar73 = vmulsd_avx512f(auVar120,auVar120);
        auVar72 = vaddsd_avx512f(auVar72,auVar73);
        auVar72 = vaddsd_avx512f(auVar72,ZEXT816(0xbff0000000000000));
        auVar80._8_8_ = 0;
        auVar80._0_8_ = dVar4;
        auVar78 = vmulsd_avx512f(auVar80,auVar72);
        if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          auVar72 = *(undefined1 (*) [16])
                     (peVar2->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array;
          auVar73 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          auVar84 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x20);
          auVar117 = *(undefined1 (*) [16])
                      ((long)(peVar2->m_Dv).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x30);
          dVar4 = *(double *)
                   ((long)(peVar2->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x40);
        }
        else {
          vmovsd_avx512f(auVar75);
          vmovsd_avx512f(auVar77);
          vmovsd_avx512f(auVar78);
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
          auVar72 = *(undefined1 (*) [16])
                     (peVar2->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array;
          auVar73 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          auVar84 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x20);
          auVar117 = *(undefined1 (*) [16])
                      ((long)(peVar2->m_Dv).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x30);
          dVar4 = *(double *)
                   ((long)(peVar2->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x40);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = local_510;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = local_388;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = dVar8;
        }
        auVar121._8_8_ = 0;
        auVar121._0_8_ = dVar4;
        auVar118._8_8_ = auVar72._0_8_;
        auVar118._0_8_ = auVar72._0_8_;
        auVar80 = vshufpd_avx(auVar72,auVar72,3);
        auVar81 = vshufpd_avx(auVar72,auVar72,1);
        auVar79 = vmovddup_avx512vl(auVar84);
        auVar80 = vmulpd_avx512vl(auVar76,auVar80);
        auVar81 = vmulsd_avx512f(auVar77,auVar81);
        auVar82 = vmulpd_avx512vl(auVar74,auVar118);
        auVar79 = vmulpd_avx512vl(auVar76,auVar79);
        auVar83 = vmovddup_avx512vl(auVar73);
        auVar83 = vmulpd_avx512vl(auVar71,auVar83);
        local_a50 = auVar83._0_8_ + auVar82._0_8_ + auVar80._0_8_;
        dStack_a48 = auVar83._8_8_ + auVar82._8_8_ + auVar80._8_8_;
        auVar72 = vmulsd_avx512f(auVar75,auVar72);
        auVar80 = vshufpd_avx512vl(auVar84,auVar84,1);
        auVar80 = vmulsd_avx512f(auVar78,auVar80);
        auVar82 = vmulsd_avx512f(auVar78,auVar73);
        local_e40._288_8_ = local_a50 * local_558;
        local_e40._296_8_ = dStack_a48 * dStack_550;
        local_bb8 = local_a50 * local_3f0;
        dStack_bb0 = dStack_a48 * dStack_3e8;
        local_a40 = auVar82._0_8_ + auVar72._0_8_ + auVar81._0_8_;
        auVar72 = vshufpd_avx512vl(auVar73,auVar73,1);
        auVar73 = vshufpd_avx512vl(auVar73,auVar73,3);
        auVar73 = vmulpd_avx512vl(auVar74,auVar73);
        auVar72 = vmulsd_avx512f(auVar75,auVar72);
        local_e40._304_8_ = local_a40 * local_548;
        auVar73 = vaddpd_avx512vl(auVar79,auVar73);
        auVar81 = vshufpd_avx512vl(auVar84,auVar84,3);
        auVar81 = vmulpd_avx512vl(auVar71,auVar81);
        local_ba8 = local_a40 * local_3e0;
        local_a50 = local_a50 * local_288;
        dStack_a48 = dStack_a48 * dStack_280;
        auVar73 = vaddpd_avx512vl(auVar81,auVar73);
        auVar84 = vmulsd_avx512f(auVar77,auVar84);
        auVar81 = vshufpd_avx512vl(auVar117,auVar117,3);
        auVar76 = vmulpd_avx512vl(auVar76,auVar81);
        local_a40 = local_a40 * local_278;
        auVar72 = vaddsd_avx512f(auVar84,auVar72);
        auVar84 = vmovddup_avx512vl(auVar117);
        local_e40._312_16_ = vmulpd_avx512vl(auVar73,local_540);
        auVar74 = vmulpd_avx512vl(auVar74,auVar84);
        local_a28 = auVar80._0_8_ + auVar72._0_8_;
        auVar72 = vshufpd_avx512vl(auVar117,auVar117,1);
        local_ba0 = vmulpd_avx512vl(auVar73,local_3d8);
        auVar72 = vmulsd_avx512f(auVar77,auVar72);
        auVar74 = vaddpd_avx512vl(auVar74,auVar76);
        auVar76 = vmovddup_avx512vl(auVar121);
        local_cf8 = local_a28 * local_530;
        auVar71 = vmulpd_avx512vl(auVar71,auVar76);
        local_b90 = local_a28 * local_3c8;
        local_a38 = vmulpd_avx512vl(auVar73,local_270);
        auVar71 = vaddpd_avx512vl(auVar71,auVar74);
        auVar73 = vmulsd_avx512f(auVar75,auVar117);
        local_a28 = local_a28 * local_260;
        auVar62._8_8_ = dStack_520;
        auVar62._0_8_ = local_528;
        local_cf0 = vmulpd_avx512vl(auVar71,auVar62);
        auVar72 = vaddsd_avx512f(auVar73,auVar72);
        auVar73 = vmulsd_avx512f(auVar78,auVar121);
        auVar72 = vaddsd_avx512f(auVar73,auVar72);
        local_a10 = auVar72._0_8_;
        local_ce0 = local_a10 * local_518;
        auVar63._8_8_ = dStack_3b8;
        auVar63._0_8_ = local_3c0;
        local_b88 = vmulpd_avx512vl(auVar71,auVar63);
        local_b78 = local_a10 * local_3b0;
        auVar64._8_8_ = dStack_250;
        auVar64._0_8_ = local_258;
        local_a20 = vmulpd_avx512vl(auVar71,auVar64);
        local_a10 = local_a10 * local_248;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar70 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_0071e039;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 9) {
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x18] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x19] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x1a] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_e48 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,9,3,1,9,3>>
                    (&local_240,a_lhs,(Matrix<double,_45,_3,_0,_45,_3> *)local_e40,&local_e48);
          pdVar69 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x1b) {
            if (pdVar69 != (double *)0x0) {
              free((void *)pdVar69[-1]);
            }
            pvVar65 = malloc(0x118);
            if (pvVar65 == (void *)0x0) {
              puVar68 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar68 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar68,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            *(void **)(((ulong)pvVar65 & 0xffffffffffffffc0) + 0x38) = pvVar65;
            pdVar69 = (double *)(((ulong)pvVar65 & 0xffffffffffffffc0) + 0x40);
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar69;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x1b;
          }
          uVar66 = 0xfffffffffffffff8;
          do {
            dVar4 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage
                    .m_data.array[uVar66 + 9];
            dVar7 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage
                    .m_data.array[uVar66 + 10];
            dVar8 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage
                    .m_data.array[uVar66 + 0xb];
            dVar9 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage
                    .m_data.array[uVar66 + 0xc];
            dVar10 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                     m_storage.m_data.array[uVar66 + 0xd];
            dVar11 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                     m_storage.m_data.array[uVar66 + 0xe];
            dVar12 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                     m_storage.m_data.array[uVar66 + 0xf];
            pdVar1 = pdVar69 + uVar66 + 8;
            *pdVar1 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar66 + 8];
            pdVar1[1] = dVar4;
            pdVar1[2] = dVar7;
            pdVar1[3] = dVar8;
            pdVar1[4] = dVar9;
            pdVar1[5] = dVar10;
            pdVar1[6] = dVar11;
            pdVar1[7] = dVar12;
            uVar66 = uVar66 + 8;
          } while (uVar66 < 0x10);
          lVar67 = 0x18;
          do {
            pdVar69[lVar67] =
                 local_240.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
                 m_data.array[lVar67];
            lVar67 = lVar67 + 1;
          } while (lVar67 != 0x1b);
          return;
        }
        pcVar70 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 3, 1>]"
        ;
        goto LAB_0071e05b;
      }
      pcVar70 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar70 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
      local_e40._24_8_ = dVar4;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar70);
  }
LAB_0071df9b:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
               );
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed. For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 8 in xi, 4 in eta, and 4 in
    // zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and zeta directions for
    // "Full Integration". However, very similar results can be obtained with fewer GQ point in each direction,
    // resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32 ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33 ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31 ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32 ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33 ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency. Since only the diagonal terms in the 6x6 stiffness matrix are
    // used, the 2nd Piola-Kirchoff stress can be calculated by simply scaling the vector of scaled Green-Lagrange
    // strains in Voight notation by the corresponding diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*E11 = D11*kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0.array() *= (0.5 * D0(0)) * m_kGQ_D0.array();

    // Each entry in SPK2_2 = D22*kGQ*E22 = D22*kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0.array() *= (0.5 * D0(1)) * m_kGQ_D0.array();

    // Each entry in SPK2_3 = D33*kGQ_D0*E33 = D33*kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0.array() *= (0.5 * D0(2)) * m_kGQ_D0.array();

    // Each entry in SPK2_4 = D44*kGQ*2*E23 = D44*kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0.array() *= D0(3) * m_kGQ_D0.array();

    // Each entry in SPK2_5 = D55*kGQ*2*E13 = D55*kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0.array() *= D0(4) * m_kGQ_D0.array();

    // Each entry in SPK2_6 = D66*kGQ*2*E12 = D66*(F11*F12+F21*F22+F31*F32)
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0.array() *= D0(5) * m_kGQ_D0.array();

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Blocks entries are calculated in a later step
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The combined result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) again for efficiency. Results are written in Voigt notation: epsilon =
    // [E11,E22,E33,2*E23,2*E13,2*E12] Note that with the material assumption being used, only [E11,E22,E33] need to be
    // calculated
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have already been scaled
    // by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point to make the
    // calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}